

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator::GenerateMembers
          (ImmutableEnumOneofFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  LogMessage *other;
  FileDescriptor *descriptor;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  Printer *local_18;
  Printer *printer_local;
  ImmutableEnumOneofFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  PrintExtraFieldInfo(&(this->super_ImmutableEnumFieldGenerator).variables_,printer);
  bVar1 = HasHazzer((this->super_ImmutableEnumFieldGenerator).descriptor_);
  local_51 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_enum_field.cc"
               ,0x1ad);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: HasHazzer(descriptor_): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  WriteFieldAccessorDocComment
            (local_18,(this->super_ImmutableEnumFieldGenerator).descriptor_,HAZZER,false);
  io::Printer::Print(local_18,&(this->super_ImmutableEnumFieldGenerator).variables_,
                     "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $has_oneof_case_message$;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (local_18,"{","}",(this->super_ImmutableEnumFieldGenerator).descriptor_);
  descriptor = FieldDescriptor::file((this->super_ImmutableEnumFieldGenerator).descriptor_);
  bVar1 = SupportUnknownEnumValue(descriptor);
  if (bVar1) {
    WriteFieldEnumValueAccessorDocComment
              (local_18,(this->super_ImmutableEnumFieldGenerator).descriptor_,GETTER,false);
    io::Printer::Print(local_18,&(this->super_ImmutableEnumFieldGenerator).variables_,
                       "$deprecation$public int ${$get$capitalized_name$Value$}$() {\n  if ($has_oneof_case_message$) {\n    return (java.lang.Integer) $oneof_name$_;\n  }\n  return $default_number$;\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (local_18,"{","}",(this->super_ImmutableEnumFieldGenerator).descriptor_);
  }
  WriteFieldAccessorDocComment
            (local_18,(this->super_ImmutableEnumFieldGenerator).descriptor_,GETTER,false);
  io::Printer::Print(local_18,&(this->super_ImmutableEnumFieldGenerator).variables_,
                     "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  if ($has_oneof_case_message$) {\n    @SuppressWarnings(\"deprecation\")\n    $type$ result = $type$.$for_number$(\n        (java.lang.Integer) $oneof_name$_);\n    return result == null ? $unknown$ : result;\n  }\n  return $default$;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (local_18,"{","}",(this->super_ImmutableEnumFieldGenerator).descriptor_);
  return;
}

Assistant:

void ImmutableEnumOneofFieldGenerator::GenerateMembers(
    io::Printer* printer) const {
  PrintExtraFieldInfo(variables_, printer);
  GOOGLE_DCHECK(HasHazzer(descriptor_));
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
  printer->Print(variables_,
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $has_oneof_case_message$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, GETTER);
    printer->Print(
        variables_,
        "$deprecation$public int ${$get$capitalized_name$Value$}$() {\n"
        "  if ($has_oneof_case_message$) {\n"
        "    return (java.lang.Integer) $oneof_name$_;\n"
        "  }\n"
        "  return $default_number$;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }
  WriteFieldAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(variables_,
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    @SuppressWarnings(\"deprecation\")\n"
                 "    $type$ result = $type$.$for_number$(\n"
                 "        (java.lang.Integer) $oneof_name$_);\n"
                 "    return result == null ? $unknown$ : result;\n"
                 "  }\n"
                 "  return $default$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
}